

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O1

CURLcode ossl_connect_common(Curl_easy *data,connectdata *conn,int sockindex,_Bool nonblocking,
                            _Bool *done)

{
  uchar uVar1;
  ssl_connect_state sVar2;
  char *cert_type;
  ssl_backend_data *psVar3;
  void *parg;
  ssl_backend_data *psVar4;
  ulong uVar5;
  hostname *phVar6;
  undefined4 uVar7;
  char cVar8;
  byte bVar9;
  _Bool _Var10;
  CURLcode CVar11;
  int iVar12;
  uint uVar13;
  uint uVar14;
  long lVar15;
  timediff_t tVar16;
  long lVar17;
  uint *puVar18;
  char *pcVar19;
  SSL_CIPHER *c;
  char *pcVar20;
  ulong uVar21;
  int *piVar22;
  SSL_METHOD *meth;
  SSL_CTX *pSVar23;
  BIO_METHOD *pBVar24;
  BIO *pBVar25;
  X509 *pXVar26;
  X509_NAME *pXVar27;
  ASN1_TIME *pAVar28;
  OCSP_RESPONSE *resp;
  X509_PUBKEY *pXVar29;
  uchar *puVar30;
  OCSP_BASICRESP *bs;
  stack_st_X509 *certs;
  X509_STORE *pXVar31;
  X509 *pXVar32;
  X509 *issuer;
  EVP_MD *dgst;
  X509_LOOKUP_METHOD *m;
  X509_LOOKUP *ctx;
  SSL *ssl;
  long lVar33;
  curl_blob *pcVar34;
  connectdata *pcVar35;
  curl_socket_t writefd;
  long lVar36;
  char *pcVar37;
  size_t size;
  size_t size_00;
  size_t size_01;
  size_t size_02;
  ulong larg;
  size_t size_03;
  size_t size_04;
  size_t size_05;
  size_t size_06;
  size_t size_07;
  int iVar38;
  ulong unaff_RBX;
  byte bVar39;
  uint uVar40;
  long lVar41;
  curl_socket_t readfd0;
  long lVar42;
  long lVar43;
  long lVar44;
  long lVar45;
  bool bVar46;
  CURLcode CVar47;
  bool bVar48;
  bool bVar49;
  char *local_9d8;
  OCSP_CERTID *local_9d0;
  int cert_status;
  undefined8 local_9b8;
  ulong local_9b0;
  void *ssl_sessionid;
  char *local_9a0;
  int crl_reason;
  char *local_990;
  curl_blob *local_988;
  curl_socket_t local_97c;
  long local_978;
  _Bool *local_970;
  char *local_968;
  char *local_960;
  ASN1_GENERALIZEDTIME *local_958;
  ASN1_GENERALIZEDTIME *thisupd;
  ASN1_GENERALIZEDTIME *rev;
  uchar *p;
  in6_addr addr;
  char error_buffer [256];
  
  lVar15 = (long)sockindex;
  if (conn->ssl[lVar15].state == ssl_connection_complete) {
    *done = true;
    return CURLE_OK;
  }
  local_9b0 = CONCAT44(local_9b0._4_4_,conn->sock[lVar15]);
  local_978 = lVar15;
  local_970 = done;
  if (conn->ssl[lVar15].connecting_state == ssl_connect_1) {
    tVar16 = Curl_timeleft(data,(curltime *)0x0,true);
    if (tVar16 < 0) {
      bVar48 = false;
      Curl_failf(data,"SSL connection timeout");
      unaff_RBX = 0x1c;
    }
    else {
      local_97c = conn->sock[local_978];
      ssl_sessionid = (void *)0x0;
      uVar1 = (conn->http_proxy).proxytype;
      if ((uVar1 != '\x02') ||
         (lVar17 = 0x128, conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)) {
        lVar17 = 0x98;
      }
      if ((uVar1 != '\x02') ||
         (lVar36 = 0x2f8, conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)) {
        lVar36 = 0x280;
      }
      if ((uVar1 != '\x02') ||
         (lVar41 = 0x628, conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)) {
        lVar41 = 0x568;
      }
      if ((uVar1 != '\x02') ||
         (lVar42 = 0x650, conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)) {
        lVar42 = 0x590;
      }
      if ((uVar1 != '\x02') ||
         (lVar43 = 0x350, conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)) {
        lVar43 = 0x2d8;
      }
      local_988 = *(curl_blob **)((conn->chunk).hexbuffer + lVar43 + -0x3d);
      if ((uVar1 != '\x02') ||
         (lVar43 = 0x690, conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)) {
        lVar43 = 0x5d0;
      }
      if (local_988 == (curl_blob *)0x0) {
        if ((uVar1 != '\x02') ||
           (lVar44 = 0x310, conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete))
        {
          lVar44 = 0x298;
        }
        local_9d8 = *(char **)((conn->chunk).hexbuffer + lVar44 + -0x3d);
      }
      else {
        local_9d8 = (char *)0x0;
      }
      if ((uVar1 != '\x02') ||
         (lVar44 = 0x308, conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)) {
        lVar44 = 0x290;
      }
      if ((uVar1 != '\x02') ||
         (lVar45 = 0x369, conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)) {
        lVar45 = 0x2f1;
      }
      if ((uVar1 != '\x02') ||
         (lVar33 = 0x648, conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)) {
        lVar33 = 0x588;
      }
      local_9b8 = (int *)CONCAT44(local_9b8._4_4_,
                                  (uint)(byte)(conn->chunk).hexbuffer[lVar45 + -0x3d]);
      pcVar19 = *(char **)((conn->chunk).hexbuffer + lVar17 + -0x3d);
      uVar21 = *(ulong *)((conn->chunk).hexbuffer + lVar36 + -0x3d);
      pcVar20 = *(char **)((long)&data->magic + lVar41);
      pcVar34 = *(curl_blob **)((long)&data->magic + lVar42);
      cert_type = *(char **)((long)&data->magic + lVar43);
      local_990 = *(char **)((conn->chunk).hexbuffer + lVar44 + -0x3d);
      local_968 = *(char **)((long)&data->magic + lVar33);
      psVar3 = conn->ssl[lVar15].backend;
      CVar11 = ossl_seed(data);
      unaff_RBX = (ulong)CVar11;
      if (CVar11 != CURLE_OK) goto LAB_005dac7f;
      if (((conn->http_proxy).proxytype != '\x02') ||
         (lVar17 = 0x678, conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)) {
        lVar17 = 0x5b8;
      }
      *(undefined8 *)((long)&data->magic + lVar17) = 1;
      if (uVar21 < 8) {
        if ((0xf3UL >> (uVar21 & 0x3f) & 1) == 0) {
          if (uVar21 == 2) {
            pcVar19 = "No SSLv2 support";
          }
          else {
            pcVar19 = "No SSLv3 support";
          }
          Curl_failf(data,pcVar19);
LAB_005db871:
          unaff_RBX = 4;
          goto LAB_005dac7f;
        }
        meth = (SSL_METHOD *)TLS_client_method();
        pSVar23 = SSL_CTX_new(meth);
        psVar3->ctx = (SSL_CTX *)pSVar23;
        if (pSVar23 == (SSL_CTX *)0x0) {
          uVar21 = ERR_peek_error();
          ossl_strerror(uVar21,error_buffer,size_01);
          Curl_failf(data,"SSL: couldn\'t create a context: %s",error_buffer);
LAB_005db6b9:
          unaff_RBX = 0x1b;
        }
        else {
          SSL_CTX_ctrl(pSVar23,0x21,0x10,(void *)0x0);
          if (((data->set).fdebug != (curl_debug_callback)0x0) &&
             (((data->set).field_0x8e5 & 8) != 0)) {
            local_9a0 = pcVar19;
            SSL_CTX_set_msg_callback((SSL_CTX *)psVar3->ctx,ossl_trace);
            pcVar19 = local_9a0;
            SSL_CTX_ctrl((SSL_CTX *)psVar3->ctx,0x10,0,conn);
            (conn->ssl[0].backend)->logger = data;
          }
          pcVar37 = (char *)0x82024850;
          uVar1 = (conn->http_proxy).proxytype;
          if ((uVar1 == '\x02') &&
             (conn->proxy_ssl[conn->sock[1] != -1].state != ssl_connection_complete)) {
            bVar9 = (data->set).proxy_ssl.field_0xb8;
          }
          else {
            bVar9 = (data->set).ssl.field_0xb8;
          }
          if ((bVar9 & 4) == 0) {
            pcVar37 = (char *)0x82024050;
          }
          if (7 < uVar21) goto LAB_005db7ad;
          if ((0xf3UL >> (uVar21 & 0x3f) & 1) == 0) goto LAB_005db871;
          if ((uVar1 != '\x02') ||
             (lVar17 = 0x2f8, conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)
             ) {
            lVar17 = 0x280;
          }
          lVar17 = *(long *)((conn->chunk).hexbuffer + lVar17 + -0x3d);
          if (lVar17 - 1U < 7) {
            lVar36 = *(long *)(&DAT_007bbf28 + lVar17 * 8);
          }
          else {
            lVar36 = 0;
          }
          pSVar23 = (SSL_CTX *)psVar3->ctx;
          local_9a0 = pcVar37;
          if ((lVar17 == 0) || (lVar17 = SSL_CTX_ctrl(pSVar23,0x7b,lVar36,(void *)0x0), lVar17 != 0)
             ) {
            if (((conn->http_proxy).proxytype != '\x02') ||
               (lVar17 = 0x300,
               conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)) {
              lVar17 = 0x288;
            }
            uVar21 = *(ulong *)((conn->chunk).hexbuffer + lVar17 + -0x3d);
            uVar5 = uVar21 << 0x30;
            uVar21 = uVar21 >> 0x10;
            larg = (uVar5 | uVar21) + 0x2fd;
            if ((uVar5 | uVar21 & 0xfffffffffffffffc) != 4) {
              larg = 0;
            }
            lVar17 = SSL_CTX_ctrl(pSVar23,0x7c,larg,(void *)0x0);
            unaff_RBX = 0x23;
            if (lVar17 != 0) {
              unaff_RBX = 0;
            }
          }
          else {
            unaff_RBX = 0x23;
          }
          if ((int)unaff_RBX != 0) goto LAB_005dac7f;
          SSL_CTX_set_options(psVar3->ctx);
          uVar13 = *(uint *)&(conn->bits).field_0x4;
          if ((uVar13 >> 0x1a & 1) != 0) {
            lVar17 = 0;
            if (2 < (data->state).httpwant) {
              pcVar35 = conn;
              if ((conn->http_proxy).proxytype == '\x02') {
                pcVar35 = (connectdata *)0x0;
                if (((uVar13 & 8) != 0) &&
                   (pcVar35 = conn,
                   conn->proxy_ssl[conn->sock[1] != -1].state != ssl_connection_complete))
                goto LAB_005db932;
              }
              error_buffer[0] = '\x02';
              error_buffer[1] = 'h';
              error_buffer[2] = '2';
              Curl_infof(data,"ALPN: offers %s","h2",pcVar35);
              lVar17 = 3;
            }
LAB_005db932:
            builtin_strncpy(error_buffer + lVar17,"\bhttp/1.1",9);
            Curl_infof(data,"ALPN: offers %s","http/1.1");
            iVar12 = SSL_CTX_set_alpn_protos(psVar3->ctx,error_buffer,(int)lVar17 + 9);
            if (iVar12 != 0) {
              pcVar19 = "Error setting ALPN";
              goto LAB_005db7b4;
            }
          }
          if ((pcVar20 != (char *)0x0 || pcVar34 != (curl_blob *)0x0) || cert_type != (char *)0x0) {
            uVar1 = (conn->http_proxy).proxytype;
            if ((uVar1 != '\x02') ||
               (lVar17 = 0x698,
               conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)) {
              lVar17 = 0x5d8;
            }
            if ((uVar1 != '\x02') ||
               (lVar36 = 0x6a0,
               conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)) {
              lVar36 = 0x5e0;
            }
            if ((uVar1 != '\x02') ||
               (lVar41 = 0x6a8,
               conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)) {
              lVar41 = 0x5e8;
            }
            if ((uVar1 != '\x02') ||
               (lVar42 = 0x6b0,
               conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)) {
              lVar42 = 0x5f0;
            }
            iVar12 = cert_stuff(data,psVar3->ctx,pcVar20,pcVar34,cert_type,
                                *(char **)((long)&data->magic + lVar17),
                                *(curl_blob **)((long)&data->magic + lVar36),
                                *(char **)((long)&data->magic + lVar41),
                                *(char **)((long)&data->magic + lVar42));
            unaff_RBX = 0x3a;
            if (iVar12 == 0) goto LAB_005dac7f;
          }
          if (((conn->http_proxy).proxytype != '\x02') ||
             (lVar17 = 0x328, conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)
             ) {
            lVar17 = 0x2b0;
          }
          pcVar20 = *(char **)((conn->chunk).hexbuffer + lVar17 + -0x3d);
          if (pcVar20 != (char *)0x0) {
            iVar12 = SSL_CTX_set_cipher_list((SSL_CTX *)psVar3->ctx,pcVar20);
            if (iVar12 == 0) {
              Curl_failf(data,"failed setting cipher list: %s",pcVar20);
              unaff_RBX = 0x3b;
              goto LAB_005dac7f;
            }
            Curl_infof(data,"Cipher selection: %s",pcVar20);
          }
          if (((conn->http_proxy).proxytype != '\x02') ||
             (lVar17 = 0x330, conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)
             ) {
            lVar17 = 0x2b8;
          }
          lVar17 = *(long *)((conn->chunk).hexbuffer + lVar17 + -0x3d);
          unaff_RBX = 0x23;
          bVar48 = true;
          local_9a0 = pcVar19;
          if (lVar17 != 0) {
            iVar12 = SSL_CTX_set_ciphersuites(psVar3->ctx,lVar17);
            if (iVar12 == 0) {
              Curl_failf(data,"failed setting TLS 1.3 cipher suite: %s",lVar17);
              unaff_RBX = 0x3b;
            }
            else {
              Curl_infof(data,"TLS 1.3 cipher selection: %s",lVar17);
            }
            bVar48 = iVar12 != 0;
          }
          if (bVar48) {
            SSL_CTX_set_post_handshake_auth(psVar3->ctx);
            if (((conn->http_proxy).proxytype != '\x02') ||
               (lVar17 = 0x360,
               conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)) {
              lVar17 = 0x2e8;
            }
            parg = *(void **)((conn->chunk).hexbuffer + lVar17 + -0x3d);
            bVar48 = true;
            if ((parg != (void *)0x0) &&
               (lVar17 = SSL_CTX_ctrl((SSL_CTX *)psVar3->ctx,0x5c,0,parg), lVar17 == 0)) {
              bVar48 = false;
              Curl_failf(data,"failed setting curves list: \'%s\'",parg);
              unaff_RBX = 0x3b;
            }
            if (bVar48) {
              uVar7 = (int)local_9b8;
              uVar21 = (ulong)local_9b8 & 1;
              uVar5 = (ulong)local_9b8 & 1;
              if ((local_988 == (curl_blob *)0x0) ||
                 (CVar11 = load_cacert_from_memory(psVar3->ctx,local_988), CVar11 == CURLE_OK)) {
LAB_005dc713:
                local_9b8 = (int *)(CONCAT44(local_9b8._4_4_,uVar7) & 0xffffffff00000001);
                if ((uVar5 == 0) || (local_9d8 == (char *)0x0 && local_990 == (char *)0x0)) {
LAB_005dc7c6:
                  pcVar19 = local_968;
                  if (local_968 != (char *)0x0) {
                    pXVar31 = SSL_CTX_get_cert_store((SSL_CTX *)psVar3->ctx);
                    m = X509_LOOKUP_file();
                    ctx = X509_STORE_add_lookup(pXVar31,m);
                    if ((ctx == (X509_LOOKUP *)0x0) ||
                       (iVar12 = X509_load_crl_file(ctx,pcVar19,1), iVar12 == 0)) {
                      Curl_failf(data,"error loading CRL file: %s",pcVar19);
                      unaff_RBX = 0x52;
                      goto LAB_005dac7f;
                    }
                    Curl_infof(data,"successfully loaded CRL file:");
                    pXVar31 = SSL_CTX_get_cert_store((SSL_CTX *)psVar3->ctx);
                    X509_STORE_set_flags(pXVar31,0xc);
                    Curl_infof(data,"  CRLfile: %s",pcVar19);
                  }
                  if ((char)local_9b8 != '\0') {
                    pXVar31 = SSL_CTX_get_cert_store((SSL_CTX *)psVar3->ctx);
                    X509_STORE_set_flags(pXVar31,0x8000);
                    if (((conn->http_proxy).proxytype == '\x02') &&
                       (conn->proxy_ssl[conn->sock[1] != -1].state != ssl_connection_complete)) {
                      if (pcVar19 == (char *)0x0) {
                        bVar9 = (data->set).proxy_ssl.field_0xb8;
LAB_005dc8e1:
                        if ((bVar9 & 0x10) == 0) {
                          pXVar31 = SSL_CTX_get_cert_store((SSL_CTX *)psVar3->ctx);
                          X509_STORE_set_flags(pXVar31,0x80000);
                        }
                      }
                    }
                    else if (pcVar19 == (char *)0x0) {
                      bVar9 = (data->set).ssl.field_0xb8;
                      goto LAB_005dc8e1;
                    }
                  }
                  SSL_CTX_set_verify((SSL_CTX *)psVar3->ctx,(int)local_9b8,(callback *)0x0);
                  _Var10 = Curl_tls_keylog_enabled();
                  if (_Var10) {
                    SSL_CTX_set_keylog_callback(psVar3->ctx,ossl_keylog_callback);
                  }
                  SSL_CTX_ctrl((SSL_CTX *)psVar3->ctx,0x2c,0x301,(void *)0x0);
                  SSL_CTX_sess_set_new_cb((SSL_CTX *)psVar3->ctx,ossl_new_session_cb);
                  if ((data->set).ssl.fsslctx != (curl_ssl_ctx_callback)0x0) {
                    Curl_set_in_callback(data,true);
                    CVar11 = (*(data->set).ssl.fsslctx)(data,psVar3->ctx,(data->set).ssl.fsslctxp);
                    Curl_set_in_callback(data,false);
                    if (CVar11 != CURLE_OK) {
                      pcVar19 = "error signaled by ssl ctx callback";
                      goto LAB_005dc996;
                    }
                  }
                  if ((SSL *)psVar3->handle != (SSL *)0x0) {
                    SSL_free((SSL *)psVar3->handle);
                  }
                  ssl = SSL_new((SSL_CTX *)psVar3->ctx);
                  psVar3->handle = (SSL *)ssl;
                  if (ssl == (SSL *)0x0) {
                    Curl_failf(data,"SSL: couldn\'t create a context (handle)");
                    goto LAB_005db6b9;
                  }
                  if (((conn->http_proxy).proxytype == '\x02') &&
                     (conn->proxy_ssl[conn->sock[1] != -1].state != ssl_connection_complete)) {
                    bVar9 = (conn->proxy_ssl_config).field_0x71;
                  }
                  else {
                    bVar9 = (conn->ssl_config).field_0x71;
                  }
                  if ((bVar9 & 4) != 0) {
                    SSL_ctrl(ssl,0x41,1,(void *)0x0);
                  }
                  SSL_set_connect_state((SSL *)psVar3->handle);
                  pcVar19 = local_9a0;
                  psVar3->server_cert = (X509 *)0x0;
                  iVar12 = inet_pton(2,local_9a0,&addr);
                  if ((iVar12 == 0) && (iVar12 = inet_pton(10,pcVar19,&addr), iVar12 == 0)) {
                    pcVar19 = Curl_ssl_snihost(data,pcVar19,(size_t *)0x0);
                    if (pcVar19 == (char *)0x0) {
LAB_005dca9d:
                      bVar48 = false;
                      Curl_failf(data,"Failed set SNI");
                      unaff_RBX = 0x23;
                    }
                    else {
                      lVar17 = SSL_ctrl((SSL *)psVar3->handle,0x37,0,pcVar19);
                      bVar48 = true;
                      if (lVar17 == 0) goto LAB_005dca9d;
                    }
                    if (!bVar48) goto LAB_005dac7f;
                  }
                  _Var10 = ossl_associate_connection(data,conn,sockindex);
                  if (!_Var10) {
                    uVar21 = ERR_get_error();
                    ossl_strerror(uVar21,error_buffer,size_05);
                    pcVar19 = "SSL: ossl_associate_connection failed: %s";
LAB_005dcb5d:
                    Curl_failf(data,pcVar19,error_buffer);
                    goto LAB_005db7be;
                  }
                  if (((conn->http_proxy).proxytype == '\x02') &&
                     (conn->proxy_ssl[conn->sock[1] != -1].state != ssl_connection_complete)) {
                    bVar9 = (data->set).proxy_ssl.primary.field_0x71;
                  }
                  else {
                    bVar9 = (data->set).ssl.primary.field_0x71;
                  }
                  if ((bVar9 & 8) != 0) {
                    Curl_ssl_sessionid_lock(data);
                    if ((conn->http_proxy).proxytype == '\x02') {
                      _Var10 = conn->proxy_ssl[conn->sock[1] != -1].state != ssl_connection_complete
                      ;
                    }
                    else {
                      _Var10 = false;
                    }
                    _Var10 = Curl_ssl_getsessionid
                                       (data,conn,_Var10,&ssl_sessionid,(size_t *)0x0,sockindex);
                    if (!_Var10) {
                      iVar12 = SSL_set_session((SSL *)psVar3->handle,(SSL_SESSION *)ssl_sessionid);
                      if (iVar12 == 0) {
                        Curl_ssl_sessionid_unlock(data);
                        uVar21 = ERR_get_error();
                        ossl_strerror(uVar21,error_buffer,size_07);
                        pcVar19 = "SSL: SSL_set_session failed: %s";
                        goto LAB_005dcb5d;
                      }
                      Curl_infof(data,"SSL re-using session ID");
                    }
                    Curl_ssl_sessionid_unlock(data);
                  }
                  if ((conn->proxy_ssl[lVar15].field_0x10 & 1) == 0) {
                    iVar12 = SSL_set_fd((SSL *)psVar3->handle,local_97c);
                    if (iVar12 == 0) {
                      uVar21 = ERR_get_error();
                      ossl_strerror(uVar21,error_buffer,size_06);
                      pcVar19 = "SSL: SSL_set_fd failed: %s";
                      goto LAB_005dcb5d;
                    }
                  }
                  else {
                    pBVar24 = BIO_f_ssl();
                    pBVar25 = BIO_new(pBVar24);
                    BIO_ctrl(pBVar25,0x6d,0,(conn->proxy_ssl[lVar15].backend)->handle);
                    SSL_set_bio((SSL *)psVar3->handle,pBVar25,pBVar25);
                  }
                  conn->ssl[lVar15].connecting_state = ssl_connect_2;
                  unaff_RBX = 0;
                }
                else {
                  if ((local_9d8 == (char *)0x0) ||
                     (iVar12 = SSL_CTX_load_verify_file(psVar3->ctx,local_9d8), iVar12 != 0)) {
                    pcVar19 = "none";
                    if ((local_990 == (char *)0x0) ||
                       (iVar12 = SSL_CTX_load_verify_dir(psVar3->ctx), pcVar19 = local_990,
                       iVar12 != 0)) {
                      pcVar20 = "none";
                      if (local_9d8 != (char *)0x0) {
                        pcVar20 = local_9d8;
                      }
                      Curl_infof(data," CAfile: %s",pcVar20);
                      Curl_infof(data," CApath: %s",pcVar19);
                      goto LAB_005dc7c6;
                    }
                    pcVar19 = "error setting certificate path: %s";
                    local_9d8 = local_990;
                  }
                  else {
                    pcVar19 = "error setting certificate file: %s";
                  }
                  Curl_failf(data,pcVar19,local_9d8);
                  unaff_RBX = 0x4d;
                }
              }
              else {
                if ((CVar11 != CURLE_OUT_OF_MEMORY) && (uVar21 == 0)) {
                  Curl_infof(data,"error importing CA certificate blob, continuing anyway");
                  goto LAB_005dc713;
                }
                pcVar19 = "error importing CA certificate blob";
LAB_005dc996:
                unaff_RBX = (ulong)CVar11;
                Curl_failf(data,pcVar19);
              }
            }
          }
        }
      }
      else {
LAB_005db7ad:
        pcVar19 = "Unrecognized parameter passed via CURLOPT_SSLVERSION";
LAB_005db7b4:
        Curl_failf(data,pcVar19);
LAB_005db7be:
        unaff_RBX = 0x23;
      }
LAB_005dac7f:
      bVar48 = (int)unaff_RBX == 0;
    }
    if (!bVar48) {
      return (CURLcode)unaff_RBX;
    }
  }
  local_988 = (curl_blob *)&(data->set).ssl.certverifyresult;
  local_9b8 = &conn->port;
  while (sVar2 = conn->ssl[lVar15].connecting_state, sVar2 - ssl_connect_2 < 3) {
    tVar16 = Curl_timeleft(data,(curltime *)0x0,true);
    if (tVar16 < 0) {
      bVar48 = false;
      Curl_failf(data,"SSL connection timeout");
      unaff_RBX = 0x1c;
    }
    else {
      sVar2 = conn->ssl[lVar15].connecting_state;
      if ((sVar2 & ~ssl_connect_2) == ssl_connect_2_reading) {
        writefd = -1;
        if (sVar2 == ssl_connect_2_writing) {
          writefd = (curl_socket_t)local_9b0;
        }
        readfd0 = -1;
        if (sVar2 == ssl_connect_2_reading) {
          readfd0 = (curl_socket_t)local_9b0;
        }
        if (nonblocking) {
          tVar16 = 0;
        }
        iVar12 = Curl_socket_check(readfd0,-1,writefd,tVar16);
        if (iVar12 < 0) {
          puVar18 = (uint *)__errno_location();
          bVar48 = false;
          Curl_failf(data,"select/poll on SSL socket, errno: %d",(ulong)*puVar18);
          unaff_RBX = 0x23;
        }
        else {
          bVar48 = true;
          if (iVar12 == 0) {
            if (nonblocking) {
              *local_970 = false;
              bVar48 = false;
              unaff_RBX = 0;
            }
            else {
              bVar48 = false;
              Curl_failf(data,"SSL connection timeout");
              unaff_RBX = 0x1c;
            }
          }
        }
        if (!bVar48) {
          bVar48 = false;
          goto LAB_005db08a;
        }
      }
      psVar3 = conn->ssl[lVar15].backend;
      ERR_clear_error();
      iVar12 = SSL_connect((SSL *)psVar3->handle);
      if (iVar12 == 1) {
        conn->ssl[lVar15].connecting_state = ssl_connect_3;
        pcVar19 = SSL_get_version((SSL *)psVar3->handle);
        c = SSL_get_current_cipher((SSL *)psVar3->handle);
        pcVar20 = SSL_CIPHER_get_name(c);
        uVar40 = 0;
        Curl_infof(data,"SSL connection using %s / %s",pcVar19,pcVar20);
        if (((conn->bits).field_0x7 & 4) == 0) goto LAB_005daf32;
        SSL_get0_alpn_selected(psVar3->handle,error_buffer,&addr);
        if (addr.__in6_u.__u6_addr32[0] == 0) {
          Curl_infof(data,"ALPN: server did not agree on a protocol. Uses default.");
        }
        else {
          Curl_infof(data,"ALPN: server accepted %.*s",addr.__in6_u._0_8_ & 0xffffffff,
                     error_buffer._0_8_);
          if (addr.__in6_u.__u6_addr32[0] == 8) {
            if (*(long *)error_buffer._0_8_ == 0x312e312f70747468) {
              conn->alpn = '\x02';
            }
          }
          else if ((addr.__in6_u.__u6_addr32[0] == 2) && (*(short *)error_buffer._0_8_ == 0x3268)) {
            conn->alpn = '\x03';
          }
        }
        Curl_multiuse_state(data,(uint)(conn->alpn == '\x03') * 3 + -1);
      }
      else {
        uVar13 = SSL_get_error((SSL *)psVar3->handle,iVar12);
        if (uVar13 == 9) {
          conn->ssl[lVar15].connecting_state = ssl_connect_2;
        }
        else if (uVar13 == 3) {
          conn->ssl[lVar15].connecting_state = ssl_connect_2_writing;
        }
        else {
          if (uVar13 != 2) {
            memset(error_buffer,0,0x100);
            conn->ssl[lVar15].connecting_state = ssl_connect_2;
            uVar21 = ERR_get_error();
            uVar40 = (uint)uVar21;
            bVar48 = (int)uVar40 < 0;
            uVar14 = 0x7fffffff;
            if (!bVar48) {
              uVar14 = 0x7fffff;
            }
            uVar14 = uVar14 & uVar40;
            bVar49 = (uVar40 & 0xff800000) != 0xa000000;
            if ((bVar49 || bVar48) || ((uVar14 != 0x415 && (uVar14 != 0x86)))) {
              ossl_strerror(uVar21,error_buffer,(ulong)(uVar40 & 0xff800000));
              bVar46 = (bVar49 || bVar48) || uVar14 != 0x45c;
              uVar40 = 0x23;
              if ((!bVar49 && !bVar48) && uVar14 == 0x45c) {
                uVar40 = 0x62;
              }
            }
            else {
              lVar17 = SSL_get_verify_result((SSL *)psVar3->handle);
              if (lVar17 == 0) {
                error_buffer[0x10] = 'v';
                error_buffer[0x11] = 'e';
                error_buffer[0x12] = 'r';
                error_buffer[0x13] = 'i';
                error_buffer[0x14] = 'f';
                error_buffer[0x15] = 'i';
                error_buffer[0x16] = 'c';
                error_buffer[0x17] = 'a';
                error_buffer[0x18] = 't';
                error_buffer[0x19] = 'i';
                error_buffer[0x1a] = 'o';
                error_buffer[0x1b] = 'n';
                error_buffer[0x1c] = ' ';
                error_buffer[0x1d] = 'f';
                error_buffer[0x1e] = 'a';
                error_buffer[0x1f] = 'i';
                error_buffer[0] = 'S';
                error_buffer[1] = 'S';
                error_buffer[2] = 'L';
                error_buffer[3] = ' ';
                error_buffer[4] = 'c';
                error_buffer[5] = 'e';
                error_buffer[6] = 'r';
                error_buffer[7] = 't';
                error_buffer[8] = 'i';
                error_buffer[9] = 'f';
                error_buffer[10] = 'i';
                error_buffer[0xb] = 'c';
                error_buffer[0xc] = 'a';
                error_buffer[0xd] = 't';
                error_buffer[0xe] = 'e';
                error_buffer[0xf] = ' ';
                builtin_strncpy(error_buffer + 0x20,"led",4);
                bVar46 = false;
                uVar40 = 0x3c;
              }
              else {
                if (((conn->http_proxy).proxytype != '\x02') ||
                   (pcVar34 = (curl_blob *)&(data->set).proxy_ssl.certverifyresult,
                   conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)) {
                  pcVar34 = local_988;
                }
                *(long *)pcVar34 = lVar17;
                pcVar19 = X509_verify_cert_error_string(lVar17);
                bVar46 = false;
                curl_msnprintf(error_buffer,0x100,"SSL certificate problem: %s",pcVar19);
                uVar40 = 0x3c;
              }
            }
            if ((uVar21 == 0) && (bVar46)) {
              uVar1 = (conn->http_proxy).proxytype;
              if ((uVar1 != '\x02') ||
                 (phVar6 = &(conn->http_proxy).host,
                 conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)) {
                phVar6 = &conn->host;
              }
              if ((uVar1 != '\x02') ||
                 (piVar22 = local_9b8,
                 conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)) {
                piVar22 = &conn->remote_port;
              }
              pcVar19 = phVar6->name;
              iVar12 = *piVar22;
              addr.__in6_u._0_8_ = 0;
              addr.__in6_u._8_8_ = 0;
              piVar22 = __errno_location();
              if (uVar13 == 5 && *piVar22 != 0) {
                Curl_strerror(*piVar22,(char *)&addr,0x50);
              }
              pcVar20 = (char *)&addr;
              if ((addr.__in6_u.__u6_addr8[0] == '\0') &&
                 (pcVar20 = "SSL_ERROR unknown", uVar13 < 0xb)) {
                pcVar20 = (&PTR_anon_var_dwarf_278aa8c_0096d458)[uVar13];
              }
              Curl_failf(data,"OpenSSL SSL_connect: %s in connection to %s:%ld ",pcVar20,pcVar19,
                         (long)iVar12);
            }
            else {
              Curl_failf(data,"%s",error_buffer);
            }
            goto LAB_005db060;
          }
          conn->ssl[lVar15].connecting_state = ssl_connect_2_reading;
        }
LAB_005daf32:
        uVar40 = 0;
      }
LAB_005db060:
      if ((uVar40 != 0) ||
         ((nonblocking && (conn->ssl[lVar15].connecting_state - ssl_connect_2 < 3)))) {
        bVar48 = false;
        unaff_RBX = (ulong)uVar40;
      }
      else {
        bVar48 = true;
      }
    }
LAB_005db08a:
    if (!bVar48) {
      return (CURLcode)unaff_RBX;
    }
  }
  if (sVar2 != ssl_connect_3) goto LAB_005dc536;
  uVar1 = (conn->http_proxy).proxytype;
  if ((uVar1 == '\x02') && (conn->proxy_ssl[conn->sock[1] != -1].state != ssl_connection_complete))
  {
    bVar9 = (conn->proxy_ssl_config).field_0x71;
  }
  else {
    bVar9 = (conn->ssl_config).field_0x71;
  }
  bVar39 = 1;
  if ((bVar9 & 1) == 0) {
    if ((uVar1 != '\x02') ||
       (lVar17 = 0x369, conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)) {
      lVar17 = 0x2f1;
    }
    bVar39 = ((conn->chunk).hexbuffer[lVar17 + -0x3d] & 2U) >> 1;
  }
  memset(&addr,0,0x100);
  pBVar24 = BIO_s_mem();
  pBVar25 = BIO_new(pBVar24);
  if (pBVar25 == (BIO *)0x0) {
    uVar21 = ERR_get_error();
    ossl_strerror(uVar21,(char *)&addr,size);
    Curl_failf(data,"BIO_new return NULL, OpenSSL error %s",&addr);
LAB_005db51d:
    CVar11 = CURLE_OUT_OF_MEMORY;
  }
  else {
    psVar3 = conn->ssl[lVar15].backend;
    if (((data->set).ssl.field_0xb8 & 1) != 0) {
      Curl_ossl_certchain(data,psVar3->handle);
    }
    pXVar26 = (X509 *)SSL_get1_peer_certificate(psVar3->handle);
    psVar3->server_cert = pXVar26;
    if (pXVar26 == (X509 *)0x0) {
      BIO_free(pBVar25);
      CVar11 = CURLE_OK;
      if (bVar39 != 0) {
        Curl_failf(data,"SSL: couldn\'t get peer certificate");
        CVar11 = CURLE_PEER_FAILED_VERIFICATION;
      }
    }
    else {
      local_9b0 = CONCAT71(local_9b0._1_7_,bVar39);
      if ((conn->http_proxy).proxytype == '\x02') {
        pcVar19 = "Proxy";
        if (conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete) {
          pcVar19 = "Server";
        }
      }
      else {
        pcVar19 = "Server";
      }
      Curl_infof(data,"%s certificate:",pcVar19);
      pXVar27 = X509_get_subject_name((X509 *)psVar3->server_cert);
      iVar12 = x509_name_oneline((X509_NAME *)pXVar27,error_buffer,size_00);
      pcVar19 = "[NONE]";
      if (iVar12 == 0) {
        pcVar19 = error_buffer;
      }
      Curl_infof(data," subject: %s",pcVar19);
      pAVar28 = (ASN1_TIME *)X509_get0_notBefore(psVar3->server_cert);
      ASN1_TIME_print(pBVar25,pAVar28);
      uVar21 = BIO_ctrl(pBVar25,3,0,&local_960);
      Curl_infof(data," start date: %.*s",uVar21 & 0xffffffff);
      BIO_ctrl(pBVar25,1,0,(void *)0x0);
      pAVar28 = (ASN1_TIME *)X509_get0_notAfter(psVar3->server_cert);
      ASN1_TIME_print(pBVar25,pAVar28);
      uVar21 = BIO_ctrl(pBVar25,3,0,&local_960);
      Curl_infof(data," expire date: %.*s",uVar21 & 0xffffffff);
      BIO_ctrl(pBVar25,1,0,(void *)0x0);
      BIO_free(pBVar25);
      if (((conn->http_proxy).proxytype == '\x02') &&
         (conn->proxy_ssl[conn->sock[1] != -1].state != ssl_connection_complete)) {
        bVar9 = (conn->proxy_ssl_config).field_0x71;
      }
      else {
        bVar9 = (conn->ssl_config).field_0x71;
      }
      cVar8 = (char)local_9b0;
      if (((bVar9 & 2) == 0) ||
         (CVar11 = Curl_ossl_verifyhost(data,conn,psVar3->server_cert), CVar11 == CURLE_OK)) {
        pXVar27 = X509_get_issuer_name((X509 *)psVar3->server_cert);
        iVar12 = x509_name_oneline((X509_NAME *)pXVar27,error_buffer,size_02);
        if (iVar12 == 0) {
          Curl_infof(data," issuer: %s",error_buffer);
          uVar1 = (conn->http_proxy).proxytype;
          if ((uVar1 == '\x02') &&
             (conn->proxy_ssl[conn->sock[1] != -1].state != ssl_connection_complete)) {
            if ((conn->proxy_ssl_config).issuercert == (char *)0x0) goto LAB_005dbb93;
LAB_005dbbce:
            if ((uVar1 == '\x02') &&
               (conn->proxy_ssl[conn->sock[1] != -1].state != ssl_connection_complete)) {
              if ((conn->proxy_ssl_config).issuercert_blob != (curl_blob *)0x0) goto LAB_005dbbfe;
LAB_005dbcc2:
              pBVar24 = BIO_s_file();
              pBVar25 = BIO_new(pBVar24);
              if (pBVar25 == (BIO *)0x0) {
                uVar21 = ERR_get_error();
                ossl_strerror(uVar21,(char *)&addr,size_04);
                Curl_failf(data,"BIO_new return NULL, OpenSSL error %s",&addr);
                X509_free((X509 *)psVar3->server_cert);
                psVar3->server_cert = (X509 *)0x0;
                goto LAB_005db51d;
              }
              if (((conn->http_proxy).proxytype != '\x02') ||
                 (lVar17 = 0x318,
                 conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)) {
                lVar17 = 0x2a0;
              }
              lVar17 = BIO_ctrl(pBVar25,0x6c,3,*(void **)((conn->chunk).hexbuffer + lVar17 + -0x3d))
              ;
              if (0 < (int)lVar17) goto LAB_005dbd32;
              if (cVar8 != '\0') {
                if (((conn->http_proxy).proxytype != '\x02') ||
                   (lVar17 = 0x318,
                   conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)) {
                  lVar17 = 0x2a0;
                }
                Curl_failf(data,"SSL: Unable to open issuer cert (%s)",
                           *(undefined8 *)((conn->chunk).hexbuffer + lVar17 + -0x3d));
              }
              BIO_free(pBVar25);
LAB_005dc01a:
              X509_free((X509 *)psVar3->server_cert);
              psVar3->server_cert = (X509 *)0x0;
              CVar11 = CURLE_SSL_ISSUER_ERROR;
            }
            else {
              if ((conn->ssl_config).issuercert_blob == (curl_blob *)0x0) goto LAB_005dbcc2;
LAB_005dbbfe:
              if ((uVar1 != '\x02') ||
                 (lVar17 = 0x358,
                 conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)) {
                lVar17 = 0x2e0;
              }
              if ((uVar1 != '\x02') ||
                 (lVar36 = 0x358,
                 conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)) {
                lVar36 = 0x2e0;
              }
              pBVar25 = BIO_new_mem_buf((void *)**(undefined8 **)
                                                  ((conn->chunk).hexbuffer + lVar17 + -0x3d),
                                        *(int *)(*(long *)((conn->chunk).hexbuffer + lVar36 + -0x3d)
                                                + 8));
              if (pBVar25 == (BIO *)0x0) {
                uVar21 = ERR_get_error();
                ossl_strerror(uVar21,(char *)&addr,size_03);
                Curl_failf(data,"BIO_new_mem_buf NULL, OpenSSL error %s",&addr);
                X509_free((X509 *)psVar3->server_cert);
                psVar3->server_cert = (X509 *)0x0;
                CVar11 = CURLE_OUT_OF_MEMORY;
              }
              else {
LAB_005dbd32:
                pXVar32 = PEM_read_bio_X509(pBVar25,(X509 **)0x0,(undefined1 *)0x0,(void *)0x0);
                if (pXVar32 == (X509 *)0x0) {
                  if (cVar8 != '\0') {
                    if (((conn->http_proxy).proxytype != '\x02') ||
                       (lVar17 = 0x318,
                       conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)) {
                      lVar17 = 0x2a0;
                    }
                    Curl_failf(data,"SSL: Unable to read issuer cert (%s)",
                               *(undefined8 *)((conn->chunk).hexbuffer + lVar17 + -0x3d));
                  }
                  BIO_free(pBVar25);
                  X509_free((X509 *)0x0);
                  goto LAB_005dc01a;
                }
                iVar12 = X509_check_issued(pXVar32,(X509 *)psVar3->server_cert);
                if (iVar12 == 0) {
                  if (((conn->http_proxy).proxytype != '\x02') ||
                     (lVar17 = 0x318,
                     conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)) {
                    lVar17 = 0x2a0;
                  }
                  Curl_infof(data," SSL certificate issuer check ok (%s)",
                             *(undefined8 *)((conn->chunk).hexbuffer + lVar17 + -0x3d));
                  BIO_free(pBVar25);
                  X509_free(pXVar32);
                  goto LAB_005dbefc;
                }
                if (cVar8 != '\0') {
                  if (((conn->http_proxy).proxytype != '\x02') ||
                     (lVar17 = 0x318,
                     conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)) {
                    lVar17 = 0x2a0;
                  }
                  Curl_failf(data,"SSL: Certificate issuer check failed (%s)",
                             *(undefined8 *)((conn->chunk).hexbuffer + lVar17 + -0x3d));
                }
                BIO_free(pBVar25);
                X509_free(pXVar32);
                X509_free((X509 *)psVar3->server_cert);
                psVar3->server_cert = (X509 *)0x0;
                CVar11 = CURLE_SSL_ISSUER_ERROR;
              }
            }
            goto LAB_005dc525;
          }
          if ((conn->ssl_config).issuercert != (char *)0x0) goto LAB_005dbbce;
LAB_005dbb93:
          if ((uVar1 == '\x02') &&
             (conn->proxy_ssl[conn->sock[1] != -1].state != ssl_connection_complete)) {
            pcVar34 = (conn->proxy_ssl_config).issuercert_blob;
          }
          else {
            pcVar34 = (conn->ssl_config).issuercert_blob;
          }
          if (pcVar34 != (curl_blob *)0x0) goto LAB_005dbbce;
LAB_005dbefc:
          lVar17 = SSL_get_verify_result((SSL *)psVar3->handle);
          uVar1 = (conn->http_proxy).proxytype;
          if ((uVar1 != '\x02') ||
             (lVar36 = 0x678, conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)
             ) {
            lVar36 = 0x5b8;
          }
          *(long *)((long)&data->magic + lVar36) = lVar17;
          if (lVar17 == 0) {
            CVar47 = CURLE_OK;
            Curl_infof(data," SSL certificate verify ok.");
          }
          else {
            if ((uVar1 == '\x02') &&
               (conn->proxy_ssl[conn->sock[1] != -1].state != ssl_connection_complete)) {
              bVar9 = (conn->proxy_ssl_config).field_0x71;
            }
            else {
              bVar9 = (conn->ssl_config).field_0x71;
            }
            if ((bVar9 & 1) == 0) {
              pcVar19 = X509_verify_cert_error_string(lVar17);
              CVar47 = CURLE_OK;
              Curl_infof(data," SSL certificate verify result: %s (%ld), continuing anyway.",pcVar19
                         ,lVar17);
            }
            else {
              CVar47 = CURLE_PEER_FAILED_VERIFICATION;
              if (cVar8 != '\0') {
                pcVar19 = X509_verify_cert_error_string(lVar17);
                Curl_failf(data,"SSL certificate verify result: %s (%ld)",pcVar19,lVar17);
              }
            }
          }
        }
        else {
          CVar47 = CURLE_PEER_FAILED_VERIFICATION;
          if (cVar8 != '\0') {
            Curl_failf(data,"SSL: couldn\'t get X509-issuer name");
          }
        }
        if (((conn->http_proxy).proxytype == '\x02') &&
           (conn->proxy_ssl[conn->sock[1] != -1].state != ssl_connection_complete)) {
          bVar9 = (conn->proxy_ssl_config).field_0x71;
        }
        else {
          bVar9 = (conn->ssl_config).field_0x71;
        }
        if ((bVar9 & 4) != 0) {
          psVar4 = conn->ssl[lVar15].backend;
          lVar17 = SSL_ctrl((SSL *)psVar4->handle,0x46,0,&ssl_sessionid);
          if (ssl_sessionid == (void *)0x0) {
            pcVar19 = "No OCSP response received";
LAB_005dc27a:
            Curl_failf(data,pcVar19);
            resp = (OCSP_RESPONSE *)0x0;
LAB_005dc289:
            bs = (OCSP_BASICRESP *)0x0;
            CVar11 = CURLE_SSL_INVALIDCERTSTATUS;
            bVar48 = false;
          }
          else {
            p = (uchar *)ssl_sessionid;
            resp = d2i_OCSP_RESPONSE((OCSP_RESPONSE **)0x0,&p,lVar17);
            if (resp == (OCSP_RESPONSE *)0x0) {
              pcVar19 = "Invalid OCSP response";
              goto LAB_005dc27a;
            }
            uVar13 = OCSP_response_status(resp);
            if (uVar13 != 0) {
              pcVar19 = OCSP_response_status_str((long)(int)uVar13);
              Curl_failf(data,"Invalid OCSP response status: %s (%d)",pcVar19,(ulong)uVar13);
              goto LAB_005dc289;
            }
            bs = OCSP_response_get1_basic(resp);
            if (bs == (OCSP_BASICRESP *)0x0) {
              Curl_failf(data,"Invalid OCSP response");
              goto LAB_005dc289;
            }
            certs = SSL_get_peer_cert_chain((SSL *)psVar4->handle);
            if (certs == (stack_st_X509 *)0x0) {
              pcVar19 = "Could not get peer certificate chain";
LAB_005dc5c3:
              bVar48 = false;
              Curl_failf(data,pcVar19);
              CVar11 = CURLE_SSL_INVALIDCERTSTATUS;
            }
            else {
              pXVar31 = SSL_CTX_get_cert_store((SSL_CTX *)psVar4->ctx);
              iVar12 = OCSP_basic_verify(bs,certs,pXVar31,0);
              if (iVar12 < 1) {
                pcVar19 = "OCSP response verification failed";
                goto LAB_005dc5c3;
              }
              pXVar32 = (X509 *)SSL_get1_peer_certificate(psVar4->handle);
              if (pXVar32 == (X509 *)0x0) {
                pcVar19 = "Error getting peer certificate";
                goto LAB_005dc5c3;
              }
              iVar12 = OPENSSL_sk_num(certs);
              iVar38 = 0;
              if (iVar12 < 1) {
                local_9d0 = (OCSP_CERTID *)0x0;
              }
              else {
                local_9d0 = (OCSP_CERTID *)0x0;
                do {
                  issuer = (X509 *)OPENSSL_sk_value(certs,iVar38);
                  iVar12 = X509_check_issued(issuer,pXVar32);
                  if (iVar12 == 0) {
                    dgst = EVP_sha1();
                    local_9d0 = OCSP_cert_to_id(dgst,pXVar32,issuer);
                    break;
                  }
                  iVar38 = iVar38 + 1;
                  iVar12 = OPENSSL_sk_num(certs);
                } while (iVar38 < iVar12);
              }
              X509_free(pXVar32);
              if (local_9d0 == (OCSP_CERTID *)0x0) {
                pcVar19 = "Error computing OCSP ID";
LAB_005dc6e7:
                Curl_failf(data,pcVar19);
LAB_005dc6ee:
                bVar48 = false;
                CVar11 = CURLE_SSL_INVALIDCERTSTATUS;
              }
              else {
                iVar12 = OCSP_resp_find_status
                                   (bs,local_9d0,&cert_status,&crl_reason,
                                    (ASN1_GENERALIZEDTIME **)&rev,(ASN1_GENERALIZEDTIME **)&thisupd,
                                    &local_958);
                OCSP_CERTID_free(local_9d0);
                if (iVar12 != 1) {
                  pcVar19 = "Could not find certificate ID in OCSP response";
                  goto LAB_005dc6e7;
                }
                iVar12 = OCSP_check_validity((ASN1_GENERALIZEDTIME *)thisupd,local_958,300,-1);
                if (iVar12 == 0) {
                  pcVar19 = "OCSP response has expired";
                  goto LAB_005dc6e7;
                }
                pcVar19 = OCSP_cert_status_str((long)cert_status);
                Curl_infof(data,"SSL certificate status: %s (%d)",pcVar19,(ulong)(uint)cert_status);
                if (cert_status != 0) {
                  if (cert_status != 1) {
                    CVar11 = CURLE_SSL_INVALIDCERTSTATUS;
                    bVar48 = false;
                    goto LAB_005dc28c;
                  }
                  pcVar19 = OCSP_crl_reason_str((long)crl_reason);
                  Curl_failf(data,"SSL certificate revocation reason: %s (%d)",pcVar19,
                             (ulong)(uint)crl_reason);
                  goto LAB_005dc6ee;
                }
                bVar48 = true;
                CVar11 = CURLE_OK;
              }
            }
          }
LAB_005dc28c:
          if (bs != (OCSP_BASICRESP *)0x0) {
            OCSP_BASICRESP_free(bs);
          }
          OCSP_RESPONSE_free(resp);
          CVar47 = CURLE_OK;
          if (!bVar48) goto LAB_005dc3ce;
        }
        CVar11 = CURLE_OK;
        if (cVar8 != '\0') {
          CVar11 = CVar47;
        }
        if (((conn->http_proxy).proxytype != '\x02') ||
           (lVar17 = 0x828, conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete))
        {
          lVar17 = 0x820;
        }
        pcVar19 = *(char **)((long)&data->magic + lVar17);
        local_960 = pcVar19;
        if (pcVar19 != (char *)0x0 && CVar11 == CURLE_OK) {
          pXVar26 = psVar3->server_cert;
          ssl_sessionid = (void *)0x0;
          if (pXVar26 == (X509 *)0x0) {
            CVar11 = CURLE_SSL_PINNEDPUBKEYNOTMATCH;
          }
          else {
            pXVar29 = (X509_PUBKEY *)X509_get_X509_PUBKEY(pXVar26);
            uVar13 = i2d_X509_PUBKEY(pXVar29,(uchar **)0x0);
            CVar11 = CURLE_SSL_PINNEDPUBKEYNOTMATCH;
            puVar30 = (uchar *)0x0;
            if (0 < (int)uVar13) {
              local_9b0 = (ulong)uVar13;
              puVar30 = (uchar *)(*Curl_cmalloc)(local_9b0);
              ssl_sessionid = puVar30;
              if (puVar30 == (uchar *)0x0) {
                puVar30 = (uchar *)0x0;
              }
              else {
                pXVar29 = (X509_PUBKEY *)X509_get_X509_PUBKEY(pXVar26);
                uVar14 = i2d_X509_PUBKEY(pXVar29,(uchar **)&ssl_sessionid);
                if ((ssl_sessionid != (void *)0x0 && uVar13 == uVar14) &&
                    (long)ssl_sessionid - (long)puVar30 == local_9b0) {
                  CVar11 = Curl_pin_peer_pubkey(data,pcVar19,puVar30,local_9b0);
                }
              }
            }
            if (puVar30 != (uchar *)0x0) {
              (*Curl_cfree)(puVar30);
            }
          }
          if (CVar11 == CURLE_OK) {
            CVar11 = CURLE_OK;
          }
          else {
            Curl_failf(data,"SSL: public key does not match pinned public key");
          }
        }
        X509_free((X509 *)psVar3->server_cert);
        psVar3->server_cert = (X509 *)0x0;
        conn->ssl[lVar15].connecting_state = ssl_connect_done;
      }
      else {
LAB_005dc3ce:
        X509_free((X509 *)psVar3->server_cert);
        psVar3->server_cert = (X509 *)0x0;
      }
    }
  }
LAB_005dc525:
  if (CVar11 != CURLE_OK) {
    return CVar11;
  }
  conn->ssl[lVar15].connecting_state = ssl_connect_done;
LAB_005dc536:
  bVar48 = conn->ssl[lVar15].connecting_state == ssl_connect_done;
  if (bVar48) {
    conn->ssl[lVar15].state = ssl_connection_complete;
    conn->recv[local_978] = ossl_recv;
    conn->send[local_978] = ossl_send;
  }
  *local_970 = bVar48;
  conn->ssl[lVar15].connecting_state = ssl_connect_1;
  return CURLE_OK;
}

Assistant:

static CURLcode ossl_connect_common(struct Curl_easy *data,
                                    struct connectdata *conn,
                                    int sockindex,
                                    bool nonblocking,
                                    bool *done)
{
  CURLcode result;
  struct ssl_connect_data *connssl = &conn->ssl[sockindex];
  curl_socket_t sockfd = conn->sock[sockindex];
  int what;

  /* check if the connection has already been established */
  if(ssl_connection_complete == connssl->state) {
    *done = TRUE;
    return CURLE_OK;
  }

  if(ssl_connect_1 == connssl->connecting_state) {
    /* Find out how much more time we're allowed */
    const timediff_t timeout_ms = Curl_timeleft(data, NULL, TRUE);

    if(timeout_ms < 0) {
      /* no need to continue if time is already up */
      failf(data, "SSL connection timeout");
      return CURLE_OPERATION_TIMEDOUT;
    }

    result = ossl_connect_step1(data, conn, sockindex);
    if(result)
      return result;
  }

  while(ssl_connect_2 == connssl->connecting_state ||
        ssl_connect_2_reading == connssl->connecting_state ||
        ssl_connect_2_writing == connssl->connecting_state) {

    /* check allowed time left */
    const timediff_t timeout_ms = Curl_timeleft(data, NULL, TRUE);

    if(timeout_ms < 0) {
      /* no need to continue if time already is up */
      failf(data, "SSL connection timeout");
      return CURLE_OPERATION_TIMEDOUT;
    }

    /* if ssl is expecting something, check if it's available. */
    if(connssl->connecting_state == ssl_connect_2_reading ||
       connssl->connecting_state == ssl_connect_2_writing) {

      curl_socket_t writefd = ssl_connect_2_writing ==
        connssl->connecting_state?sockfd:CURL_SOCKET_BAD;
      curl_socket_t readfd = ssl_connect_2_reading ==
        connssl->connecting_state?sockfd:CURL_SOCKET_BAD;

      what = Curl_socket_check(readfd, CURL_SOCKET_BAD, writefd,
                               nonblocking?0:timeout_ms);
      if(what < 0) {
        /* fatal error */
        failf(data, "select/poll on SSL socket, errno: %d", SOCKERRNO);
        return CURLE_SSL_CONNECT_ERROR;
      }
      if(0 == what) {
        if(nonblocking) {
          *done = FALSE;
          return CURLE_OK;
        }
        /* timeout */
        failf(data, "SSL connection timeout");
        return CURLE_OPERATION_TIMEDOUT;
      }
      /* socket is readable or writable */
    }

    /* Run transaction, and return to the caller if it failed or if this
     * connection is done nonblocking and this loop would execute again. This
     * permits the owner of a multi handle to abort a connection attempt
     * before step2 has completed while ensuring that a client using select()
     * or epoll() will always have a valid fdset to wait on.
     */
    result = ossl_connect_step2(data, conn, sockindex);
    if(result || (nonblocking &&
                  (ssl_connect_2 == connssl->connecting_state ||
                   ssl_connect_2_reading == connssl->connecting_state ||
                   ssl_connect_2_writing == connssl->connecting_state)))
      return result;

  } /* repeat step2 until all transactions are done. */

  if(ssl_connect_3 == connssl->connecting_state) {
    result = ossl_connect_step3(data, conn, sockindex);
    if(result)
      return result;
  }

  if(ssl_connect_done == connssl->connecting_state) {
    connssl->state = ssl_connection_complete;
    conn->recv[sockindex] = ossl_recv;
    conn->send[sockindex] = ossl_send;
    *done = TRUE;
  }
  else
    *done = FALSE;

  /* Reset our connect state machine */
  connssl->connecting_state = ssl_connect_1;

  return CURLE_OK;
}